

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86IMUL(uchar *stream,x86Reg dst,x86Reg src)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  
  bVar1 = 8 < (int)src | (8 < (int)dst) << 2;
  bVar3 = bVar1 != 0;
  if (bVar3) {
    *stream = bVar1 | 0x40;
  }
  (stream + bVar3)[0] = '\x0f';
  (stream + bVar3)[1] = 0xaf;
  uVar2 = encodeRegister(src,regCode[dst]);
  stream[(ulong)bVar3 + 2] = uVar2;
  return bVar3 + 3;
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg dst, x86Reg src)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, src, dst);
	*stream++ = 0x0f;
	*stream++ = 0xaf;
	*stream++ = encodeRegister(src, regCode[dst]);

	return int(stream - start);
}